

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O3

long sd_cust(int child,long skip_count)

{
  NthElement(skip_count * 9,&Seed[0x1a].value);
  Seed[0x1a].nCalls = Seed[0x1a].nCalls + skip_count * 9;
  NthElement(skip_count * 2,&Seed[0x1f].value);
  Seed[0x1f].nCalls = Seed[0x1f].nCalls + skip_count * 2;
  NthElement(skip_count,&Seed[0x1b].value);
  Seed[0x1b].nCalls = Seed[0x1b].nCalls + skip_count;
  NthElement(skip_count * 3,&Seed[0x1c].value);
  Seed[0x1c].nCalls = Seed[0x1c].nCalls + skip_count * 3;
  NthElement(skip_count,&Seed[0x1d].value);
  Seed[0x1d].nCalls = Seed[0x1d].nCalls + skip_count;
  NthElement(skip_count,&Seed[0x1e].value);
  Seed[0x1e].nCalls = Seed[0x1e].nCalls + skip_count;
  return 0;
}

Assistant:

long 
sd_cust(int child, DSS_HUGE skip_count)
{
   UNUSED(child);
   
   ADVANCE_STREAM(C_ADDR_SD, skip_count * 9);
   ADVANCE_STREAM(C_CMNT_SD, skip_count * 2);
   ADVANCE_STREAM(C_NTRG_SD, skip_count);
   ADVANCE_STREAM(C_PHNE_SD, 3L * skip_count);
   ADVANCE_STREAM(C_ABAL_SD, skip_count);
   ADVANCE_STREAM(C_MSEG_SD, skip_count);
   return(0L);
}